

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_filter_ws<false>(Parser *this,substr r,size_t *i,size_t *pos)

{
  char cVar1;
  pfn_error p_Var2;
  char *pcVar3;
  size_t sVar4;
  code *pcVar5;
  Location LVar6;
  bool bVar7;
  ulong uVar8;
  csubstr cVar9;
  ro_substr chars;
  substr r_local;
  char *pcStack_78;
  size_t local_70;
  char msg [44];
  
  r_local.len = r.len;
  r_local.str = r.str;
  uVar8 = *i;
  if (r_local.len <= uVar8) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    handle_error(0x1e7ac6,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  cVar1 = r_local.str[uVar8];
  if ((cVar1 != '\t') && (cVar1 != ' ')) {
    builtin_strncpy(msg + 0x20,"rr == \'\\t\')",0xc);
    builtin_strncpy(msg + 0x10,"urr == \' \' || cu",0x10);
    builtin_strncpy(msg,"check failed: (c",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_70 = cVar9.len;
    pcStack_78 = cVar9.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7bf3) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7bf3) << 0x40,8);
    LVar6.name.str = pcStack_78;
    LVar6.name.len = local_70;
    (*p_Var2)(msg,0x2c,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if (uVar8 == 0) {
    uVar8 = basic_substring<char>::first_not_of(&r_local,' ',0);
  }
  else {
    chars.len = 2;
    chars.str = " \t";
    uVar8 = basic_substring<char>::first_not_of(&r_local,chars,uVar8);
  }
  if (uVar8 == 0xffffffffffffffff) {
    *i = r_local.len;
  }
  else {
    if (r_local.len <= uVar8) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    if ((r_local.str[uVar8] == '\r') || (r_local.str[uVar8] == '\n')) {
      *i = uVar8 - 1;
    }
    else {
      pcVar3 = (this->m_filter_arena).str;
      sVar4 = *pos;
      *pos = sVar4 + 1;
      pcVar3[sVar4] = cVar1;
    }
  }
  return;
}

Assistant:

void Parser::_filter_ws(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfws(fmt, ...) _c4dbgpf("filt_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfws(...)
    #endif

    const char curr = r[*i];
    _c4dbgfws("found whitespace '{}'", _c4prc(curr));
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == ' ' || curr == '\t');

    size_t first = *i > 0 ? r.first_not_of(" \t", *i) : r.first_not_of(' ', *i);
    if(first != npos)
    {
        if(r[first] == '\n' || r[first] == '\r') // skip trailing whitespace
        {
            _c4dbgfws("whitespace is trailing on line. firstnonws='{}'@{}", _c4prc(r[first]), first);
            *i = first - 1; // correct for the loop increment
        }
        else // a legit whitespace
        {
            m_filter_arena.str[(*pos)++] = curr;
            _c4dbgfws("legit whitespace. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
        }
    }
    else
    {
        _c4dbgfws("... everything else is trailing whitespace{}", "");
        if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            for(size_t j = *i; j < r.len; ++j)
                m_filter_arena.str[(*pos)++] = r[j];
        *i = r.len;
    }

    #undef _c4dbgfws
}